

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteVerilog(char *pFileName,Bac_Man_t *p,int fUseAssign)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  Vec_Str_t *pVVar7;
  char *pcVar8;
  Vec_Str_t *pVVar9;
  size_t sVar10;
  char *pcVar11;
  FILE *__s;
  ulong uVar12;
  int i_1;
  int i;
  long lVar13;
  long lVar14;
  
  pvVar4 = p->pMioLib;
  if ((pvVar4 != (void *)0x0) && (pvVar6 = Abc_FrameReadLibGen(), pvVar4 != pvVar6)) {
    puts("Genlib library used in the mapped design is not longer a current library.");
    return;
  }
  pVVar7 = (Vec_Str_t *)malloc(0x10);
  pVVar7->nCap = 10000;
  pVVar7->nSize = 0;
  pcVar8 = (char *)malloc(10000);
  pVVar7->pArray = pcVar8;
  p->vOut = pVVar7;
  pVVar9 = (Vec_Str_t *)malloc(0x10);
  pVVar9->nCap = 1000;
  pVVar9->nSize = 0;
  pcVar8 = (char *)malloc(1000);
  pVVar9->pArray = pcVar8;
  p->vOut2 = pVVar9;
  lVar13 = 0;
  do {
    cVar1 = "// Design \""[lVar13];
    uVar2 = pVVar7->nSize;
    if (uVar2 == pVVar7->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        sVar10 = (ulong)uVar2 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = (int)sVar10;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar3 = pVVar7->nSize;
    pVVar7->nSize = iVar3 + 1;
    pcVar8[iVar3] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0xb);
  pcVar8 = p->pName;
  pVVar7 = p->vOut;
  sVar10 = strlen(pcVar8);
  if (0 < (int)(uint)sVar10) {
    uVar12 = 0;
    do {
      cVar1 = pcVar8[uVar12];
      uVar2 = pVVar7->nSize;
      if (uVar2 == pVVar7->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (char *)0x0) {
            pcVar11 = (char *)malloc(0x10);
          }
          else {
            pcVar11 = (char *)realloc(pVVar7->pArray,0x10);
          }
          pVVar7->pArray = pcVar11;
          pVVar7->nCap = 0x10;
        }
        else {
          sVar5 = (ulong)uVar2 * 2;
          if (pVVar7->pArray == (char *)0x0) {
            pcVar11 = (char *)malloc(sVar5);
          }
          else {
            pcVar11 = (char *)realloc(pVVar7->pArray,sVar5);
          }
          pVVar7->pArray = pcVar11;
          pVVar7->nCap = (int)sVar5;
        }
      }
      else {
        pcVar11 = pVVar7->pArray;
      }
      iVar3 = pVVar7->nSize;
      pVVar7->nSize = iVar3 + 1;
      pcVar11[iVar3] = cVar1;
      uVar12 = uVar12 + 1;
    } while (((uint)sVar10 & 0x7fffffff) != uVar12);
    pVVar7 = p->vOut;
  }
  lVar13 = 0;
  do {
    cVar1 = "\" written via CBA package in ABC on "[lVar13];
    uVar2 = pVVar7->nSize;
    if (uVar2 == pVVar7->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        sVar10 = (ulong)uVar2 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = (int)sVar10;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar3 = pVVar7->nSize;
    pVVar7->nSize = iVar3 + 1;
    pcVar8[iVar3] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x24);
  pVVar7 = p->vOut;
  pcVar8 = Extra_TimeStamp();
  sVar10 = strlen(pcVar8);
  if (0 < (int)(uint)sVar10) {
    uVar12 = 0;
    do {
      cVar1 = pcVar8[uVar12];
      uVar2 = pVVar7->nSize;
      if (uVar2 == pVVar7->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (char *)0x0) {
            pcVar11 = (char *)malloc(0x10);
          }
          else {
            pcVar11 = (char *)realloc(pVVar7->pArray,0x10);
          }
          pVVar7->pArray = pcVar11;
          pVVar7->nCap = 0x10;
        }
        else {
          sVar5 = (ulong)uVar2 * 2;
          if (pVVar7->pArray == (char *)0x0) {
            pcVar11 = (char *)malloc(sVar5);
          }
          else {
            pcVar11 = (char *)realloc(pVVar7->pArray,sVar5);
          }
          pVVar7->pArray = pcVar11;
          pVVar7->nCap = (int)sVar5;
        }
      }
      else {
        pcVar11 = pVVar7->pArray;
      }
      iVar3 = pVVar7->nSize;
      pVVar7->nSize = iVar3 + 1;
      pcVar11[iVar3] = cVar1;
      uVar12 = uVar12 + 1;
    } while (((uint)sVar10 & 0x7fffffff) != uVar12);
  }
  pVVar7 = p->vOut;
  lVar13 = 0;
  do {
    cVar1 = "1 1.00  1000\n2 1.00  1000 1200\n3 1.00  1000 1200 1400\n4 1.00  1000 1200 1400 1600\n5 1.00  1000 1200 1400 1600 1800\n6 1.00  1000 1200 1400 1600 1800 2000\n\n\n"
            [lVar13 + 0x99];
    uVar2 = pVVar7->nSize;
    if (uVar2 == pVVar7->nCap) {
      if ((int)uVar2 < 0x10) {
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(0x10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,0x10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = 0x10;
      }
      else {
        sVar10 = (ulong)uVar2 * 2;
        if (pVVar7->pArray == (char *)0x0) {
          pcVar8 = (char *)malloc(sVar10);
        }
        else {
          pcVar8 = (char *)realloc(pVVar7->pArray,sVar10);
        }
        pVVar7->pArray = pcVar8;
        pVVar7->nCap = (int)sVar10;
      }
    }
    else {
      pcVar8 = pVVar7->pArray;
    }
    iVar3 = pVVar7->nSize;
    pVVar7->nSize = iVar3 + 1;
    pcVar8[iVar3] = cVar1;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 2);
  Bac_ManAssignInternWordNames(p);
  if (0 < p->nNtks) {
    lVar13 = 0xd0;
    lVar14 = 0;
    do {
      Bac_ManWriteVerilogNtk((Bac_Ntk_t *)((long)&p->pNtks->pDesign + lVar13),fUseAssign);
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0xd0;
    } while (lVar14 < p->nNtks);
  }
  if (p->vOut != (Vec_Str_t *)0x0) {
    if (0 < p->vOut->nSize) {
      __s = fopen(pFileName,"wb");
      if (__s == (FILE *)0x0) {
        printf("Cannot open file \"%s\" for writing.\n",pFileName);
      }
      else {
        fwrite(p->vOut->pArray,1,(long)p->vOut->nSize,__s);
        fclose(__s);
      }
    }
    pVVar7 = p->vOut;
    if (pVVar7 != (Vec_Str_t *)0x0) {
      if (pVVar7->pArray != (char *)0x0) {
        free(pVVar7->pArray);
        p->vOut->pArray = (char *)0x0;
        pVVar7 = p->vOut;
        if (pVVar7 == (Vec_Str_t *)0x0) goto LAB_003a3f87;
      }
      free(pVVar7);
      p->vOut = (Vec_Str_t *)0x0;
    }
  }
LAB_003a3f87:
  pVVar7 = p->vOut2;
  if (pVVar7 != (Vec_Str_t *)0x0) {
    if (pVVar7->pArray != (char *)0x0) {
      free(pVVar7->pArray);
      p->vOut2->pArray = (char *)0x0;
      pVVar7 = p->vOut2;
      if (pVVar7 == (Vec_Str_t *)0x0) {
        return;
      }
    }
    free(pVVar7);
    p->vOut2 = (Vec_Str_t *)0x0;
  }
  return;
}

Assistant:

void Bac_ManWriteVerilog( char * pFileName, Bac_Man_t * p, int fUseAssign )
{
    Bac_Ntk_t * pNtk; int i;
    // check the library
    if ( p->pMioLib && p->pMioLib != Abc_FrameReadLibGen() )
    {
        printf( "Genlib library used in the mapped design is not longer a current library.\n" );
        return;
    }
    // derive the stream
    p->vOut = Vec_StrAlloc( 10000 );
    p->vOut2 = Vec_StrAlloc( 1000 );
    Vec_StrPrintStr( p->vOut, "// Design \"" );
    Vec_StrPrintStr( p->vOut, Bac_ManName(p) );
    Vec_StrPrintStr( p->vOut, "\" written via CBA package in ABC on " );
    Vec_StrPrintStr( p->vOut, Extra_TimeStamp() );
    Vec_StrPrintStr( p->vOut, "\n\n" );
    Bac_ManAssignInternWordNames( p );
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_ManWriteVerilogNtk( pNtk, fUseAssign );
    // dump into file
    if ( p->vOut && Vec_StrSize(p->vOut) > 0 )
    {
        FILE * pFile = fopen( pFileName, "wb" );
        if ( pFile == NULL )
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        else
        {
            fwrite( Vec_StrArray(p->vOut), 1, Vec_StrSize(p->vOut), pFile );
            fclose( pFile );
        }
    }
    Vec_StrFreeP( &p->vOut );
    Vec_StrFreeP( &p->vOut2 );
}